

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::killTimer(QObject *this,TimerId id)

{
  ulong uVar1;
  QObjectData *pQVar2;
  QThread *pQVar3;
  long lVar4;
  int iVar5;
  QThread *pQVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ushort *puVar8;
  ulong uVar9;
  _func_int **pp_Var10;
  long lVar11;
  long in_FS_OFFSET;
  QString QStack_68;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d;
  pQVar3 = (QThread *)pQVar2[1].q_ptr[5]._vptr_QObject;
  pQVar6 = QThread::currentThread();
  if (pQVar6 == pQVar3) {
    if (0 < (int)id) {
      pp_Var10 = pQVar2[1]._vptr_QObjectData;
      if ((pp_Var10 != (_func_int **)0x0) && (pp_Var10[8] != (_func_int *)0x0)) {
        lVar11 = -0x100000000;
        uVar9 = 0xfffffffffffffffc;
        do {
          if ((long)pp_Var10[8] * -4 + uVar9 == -4) goto LAB_002b0de6;
          uVar1 = uVar9 + 4;
          lVar11 = lVar11 + 0x100000000;
          lVar4 = uVar9 + 4;
          uVar9 = uVar1;
        } while (*(TimerId *)(pp_Var10[7] + lVar4) != id);
        if ((int)(~uVar1 >> 2) != 0) {
          if (pQVar2[1].q_ptr[6]._vptr_QObject != (_func_int **)0x0) {
            QAbstractEventDispatcher::unregisterTimer
                      ((QAbstractEventDispatcher *)pQVar2[1].q_ptr[6]._vptr_QObject,id);
            pp_Var10 = pQVar2[1]._vptr_QObjectData;
          }
          if ((pp_Var10[6] == (_func_int *)0x0) || (1 < *(int *)pp_Var10[6])) {
            QArrayDataPointer<Qt::TimerId>::reallocateAndGrow
                      ((QArrayDataPointer<Qt::TimerId> *)(pp_Var10 + 6),GrowsAtEnd,0,
                       (QArrayDataPointer<Qt::TimerId> *)0x0);
          }
          QtPrivate::QPodArrayOps<Qt::TimerId>::erase
                    ((QPodArrayOps<Qt::TimerId> *)(pp_Var10 + 6),
                     (TimerId *)(pp_Var10[7] + (lVar11 >> 0x20) * 4),1);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QAbstractEventDispatcherPrivate::releaseTimerId(id);
            return;
          }
          goto LAB_002b0eb3;
        }
      }
LAB_002b0de6:
      local_50.context.version = 2;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.function._4_4_ = 0;
      local_50.context.category = "default";
      iVar5 = (**this->_vptr_QObject)(this);
      pcVar7 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar5));
      objectName(&QStack_68,this);
      puVar8 = QString::utf16(&QStack_68);
      QMessageLogger::warning
                (&local_50,
                 "QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed"
                 ,id,this,pcVar7,puVar8);
      killTimer((QObject *)&QStack_68);
    }
  }
  else {
    killTimer();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002b0eb3:
  __stack_chk_fail();
}

Assistant:

void QObject::killTimer(Qt::TimerId id)
{
    Q_D(QObject);
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::killTimer: Timers cannot be stopped from another thread");
        return;
    }
    if (id > Qt::TimerId::Invalid) {
        int at = d->extraData ? d->extraData->runningTimers.indexOf(id) : -1;
        if (at == -1) {
            // timer isn't owned by this object
            qWarning("QObject::killTimer(): Error: timer id %d is not valid for object %p (%s, %ls), timer has not been killed",
                     qToUnderlying(id),
                     this,
                     metaObject()->className(),
                     qUtf16Printable(objectName()));
            return;
        }

        auto thisThreadData = d->threadData.loadRelaxed();
        if (thisThreadData->hasEventDispatcher())
            thisThreadData->eventDispatcher.loadRelaxed()->unregisterTimer(id);

        d->extraData->runningTimers.remove(at);
        QAbstractEventDispatcherPrivate::releaseTimerId(id);
    }
}